

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::
unordered_flat_set<slang::parsing::KnownSystemName,slang::hash<slang::parsing::KnownSystemName,void>,std::equal_to<slang::parsing::KnownSystemName>,std::allocator<slang::parsing::KnownSystemName>>
::unordered_flat_set<slang::parsing::KnownSystemName_const*>
          (unordered_flat_set<slang::parsing::KnownSystemName,slang::hash<slang::parsing::KnownSystemName,void>,std::equal_to<slang::parsing::KnownSystemName>,std::allocator<slang::parsing::KnownSystemName>>
           *this,KnownSystemName *first,KnownSystemName *last,size_type n,hasher *h,key_equal *pred,
          allocator_type *a)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 local_21;
  
  detail::foa::
  table_arrays<slang::parsing::KnownSystemName,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<slang::parsing::KnownSystemName>_>
  ::new_(this,&local_21,n);
  uVar1 = *(long *)(this + 8) * 0xf + 0xe;
  if (*(long *)(this + 0x18) == 0) {
    uVar1 = 0;
  }
  uVar2 = (ulong)((float)uVar1 * 0.875);
  uVar2 = (long)((float)uVar1 * 0.875 - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2;
  if (uVar1 < 0x1e) {
    uVar2 = uVar1;
  }
  *(ulong *)(this + 0x20) = uVar2;
  *(undefined8 *)(this + 0x28) = 0;
  insert<slang::parsing::KnownSystemName_const*>(this,first,last);
  return;
}

Assistant:

unordered_flat_set(Iterator first, Iterator last, size_type n = 0, hasher const& h = hasher(),
                       key_equal const& pred = key_equal(),
                       allocator_type const& a = allocator_type()) :
        unordered_flat_set(n, h, pred, a) {
        this->insert(first, last);
    }